

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

int __thiscall QDateTime::offsetFromUtc(QDateTime *this)

{
  QDateTimePrivate *pQVar1;
  TransitionOptions resolve;
  DaylightStatus dst;
  long in_FS_OFFSET;
  ZoneState local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d;
  if (((ulong)pQVar1 & 1) == 0) {
    if ((~(pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
          super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i & 6) == 0) {
      local_30.offset = pQVar1->m_offsetFromUtc;
      goto LAB_0030e9ff;
    }
  }
  else if (((uint)pQVar1 & 0x36) == 6) {
    dst = DaylightTime;
    if (-1 < (char)pQVar1) {
      dst = (uint)(((uint)pQVar1 >> 6 & 1) != 0) + UnknownDaylightTime;
    }
    resolve = toTransitionOptions(dst);
    QDateTimePrivate::localStateAtMillis(&local_30,(long)pQVar1 >> 8,resolve);
    goto LAB_0030e9ff;
  }
  local_30.offset = 0;
LAB_0030e9ff:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return local_30.offset;
  }
  __stack_chk_fail();
}

Assistant:

int QDateTime::offsetFromUtc() const
{
    const auto status = getStatus(d);
    if (!status.testFlags(QDateTimePrivate::ValidDate | QDateTimePrivate::ValidTime))
        return 0;
    // But allow invalid date-time (e.g. gap's resolution) to report its offset.
    if (!d.isShort())
        return d->m_offsetFromUtc;

    auto spec = extractSpec(status);
    if (spec == Qt::LocalTime) {
        // We didn't cache the value, so we need to calculate it:
        const auto resolve = toTransitionOptions(extractDaylightStatus(status));
        return QDateTimePrivate::localStateAtMillis(getMSecs(d), resolve).offset;
    }

    Q_ASSERT(spec == Qt::UTC);
    return 0;
}